

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.h
# Opt level: O0

void __thiscall
Js::RangeBase<Js::SourceFunctionNode>::Add
          (RangeBase<Js::SourceFunctionNode> *this,SourceFunctionNode i,SourceFunctionNode j,
          RangeBase<Js::SourceFunctionNode> *oppositeRange)

{
  code *pcVar1;
  SourceFunctionNode this_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Type *pTVar6;
  uint *puVar7;
  char *n;
  undefined8 *in_FS_OFFSET;
  RangeUnit<Js::SourceFunctionNode> unit_00;
  RangeUnit<Js::SourceFunctionNode> unit_01;
  RangeUnit<Js::SourceFunctionNode> unit_02;
  RangeUnit<Js::SourceFunctionNode> unit_03;
  undefined1 local_124 [8];
  Unit topUnit;
  Unit lowUnit;
  IntersectionCase intersectionCase;
  bool c4;
  bool c3;
  bool c2;
  bool c1;
  Unit *unit;
  EditingIterator it;
  undefined1 auStack_38 [8];
  RangeUnit<Js::SourceFunctionNode> a;
  RangeBase<Js::SourceFunctionNode> *oppositeRange_local;
  RangeBase<Js::SourceFunctionNode> *this_local;
  SourceFunctionNode j_local;
  SourceFunctionNode i_local;
  
  a.j = (SourceFunctionNode)oppositeRange;
  RangeUnit<Js::SourceFunctionNode>::RangeUnit((RangeUnit<Js::SourceFunctionNode> *)auStack_38,i,j);
  SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>::Prepend
            (&this->range,(RangeUnit<Js::SourceFunctionNode> *)auStack_38);
  if (a.j != (SourceFunctionNode)0x0) {
    bVar2 = SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
            ::Empty((SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
                     *)a.j);
    this_00 = a.j;
    n = (char *)oppositeRange;
    if (bVar2) {
      join_0x00000010_0x00000000_ = GetFullRange<Js::SourceFunctionNode>();
      SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>::Prepend
                ((SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
                  *)this_00,(RangeUnit<Js::SourceFunctionNode> *)&it.super_EditingIterator.last);
      n = (char *)oppositeRange;
    }
    SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>::
    GetEditingIterator((EditingIterator *)&unit,
                       (SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
                        *)a.j);
    while (bVar2 = SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
                   ::EditingIterator::Next((EditingIterator *)&unit), bVar2) {
      pTVar6 = SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
               ::Iterator::Data((Iterator *)&unit);
      unit_00.j = i;
      unit_00.i = pTVar6->j;
      bVar2 = RangeUnitContains<Js::SourceFunctionNode>
                        ((Js *)pTVar6->i,unit_00,(SourceFunctionNode)n);
      unit_01.j = j;
      unit_01.i = pTVar6->j;
      bVar3 = RangeUnitContains<Js::SourceFunctionNode>
                        ((Js *)pTVar6->i,unit_01,(SourceFunctionNode)n);
      unit_02.j = pTVar6->i;
      unit_02.i = a.i;
      bVar4 = RangeUnitContains<Js::SourceFunctionNode>
                        ((Js *)auStack_38,unit_02,(SourceFunctionNode)n);
      unit_03.j = pTVar6->j;
      unit_03.i = a.i;
      bVar5 = RangeUnitContains<Js::SourceFunctionNode>
                        ((Js *)auStack_38,unit_03,(SourceFunctionNode)n);
      puVar7 = &switchD_0025ecd3::switchdataD_003e38c0;
      switch(bVar2 + bVar3 * '\x02' + bVar4 * '\x04' + bVar5 * '\b') {
      case '\0':
        n = (char *)puVar7;
        break;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        n = "UNREACHED";
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.h"
                                    ,0x3c4,"((0))","UNREACHED");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
        break;
      case '\x03':
        topUnit.j = pTVar6->i;
        n = *(char **)&pTVar6->i;
        topUnit.i = pTVar6->j;
        local_124 = (undefined1  [8])n;
        GetPrevious<Js::SourceFunctionNode>((SourceFunctionNode)auStack_38);
        local_124 = (undefined1  [8])GetNext<Js::SourceFunctionNode>(a.i);
        SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>::
        EditingIterator::InsertBefore
                  ((EditingIterator *)&unit,(RangeUnit<Js::SourceFunctionNode> *)&topUnit.j);
        SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>::
        EditingIterator::InsertBefore
                  ((EditingIterator *)&unit,(RangeUnit<Js::SourceFunctionNode> *)local_124);
        SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>::
        EditingIterator::RemoveCurrent((EditingIterator *)&unit);
        break;
      case '\x06':
      case '\a':
        n = (char *)GetNext<Js::SourceFunctionNode>(a.i);
        pTVar6->i = (SourceFunctionNode)n;
        break;
      case '\t':
      case '\v':
        n = (char *)GetPrevious<Js::SourceFunctionNode>((SourceFunctionNode)auStack_38);
        pTVar6->j = (SourceFunctionNode)n;
        break;
      case '\f':
      case '\r':
      case '\x0e':
      case '\x0f':
        SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>::
        EditingIterator::RemoveCurrent((EditingIterator *)&unit);
        n = (char *)puVar7;
      }
    }
  }
  return;
}

Assistant:

void
RangeBase<TRangeUnitData>::Add(TRangeUnitData i, TRangeUnitData j, RangeBase<TRangeUnitData>* oppositeRange)
{
    RangeUnit<TRangeUnitData> a(i, j);
    range.Prepend(a);
    if (oppositeRange)
    {
        if (oppositeRange->range.Empty())
        {
            oppositeRange->range.Prepend(GetFullRange<TRangeUnitData>());
        }
        // Do an intersection
        auto it = oppositeRange->range.GetEditingIterator();
        while (it.Next())
        {
            Unit& unit = it.Data();
            bool c1 = RangeUnitContains(unit, i);
            bool c2 = RangeUnitContains(unit, j);
            bool c3 = RangeUnitContains(a, unit.i);
            bool c4 = RangeUnitContains(a, unit.j);
            enum IntersectionCase
            {
                NoIntersection = 0,
                AddedFullyContained = 3, // [ u [a] ]
                IntersectionAdded_Unit = 6, // [ a [ ] u ]
                CommonLowBound_Unit = 7, // [[ a ] u ]
                IntersectionUnit_Added = 9, // [ u [ ] a ]
                CommonTopBound_Unit = 11, // [ u [ a ]]
                UnitFullyContained = 12, // [ a [u] ]
                CommonLowBound_Added = 13, // [[ u ] a ]
                CommonTopBound_Added = 14, // [ a [ u ]]
                FullIntersection = 15 // [[a, u]]
            };
            IntersectionCase intersectionCase = (IntersectionCase)((int)c1 | (c2 << 1) | (c3 << 2) | (c4 << 3));
            switch (intersectionCase)
            {
            case NoIntersection:
                // Nothing to do
                break;
            case AddedFullyContained:
            {
                // Need to break the current in 2
                Unit lowUnit = unit;
                Unit topUnit = unit;
                lowUnit.j = GetPrevious(a.i);
                topUnit.i = GetNext(a.j);
                it.InsertBefore(lowUnit);
                it.InsertBefore(topUnit);
                it.RemoveCurrent();
                break;
            }
            case IntersectionAdded_Unit:
            case CommonLowBound_Unit:
                // Move the unit lower bound after the added upper bound
                unit.i = GetNext(a.j);
                break;
            case IntersectionUnit_Added:
            case CommonTopBound_Unit:
                // Move the unit upper bound before the added lower bound
                unit.j = GetPrevious(a.i);
                break;
            case CommonTopBound_Added:
            case CommonLowBound_Added:
            case UnitFullyContained:
            case FullIntersection:
                // Remove the unit
                it.RemoveCurrent();
                break;
            default:
                Assert(UNREACHED);
                break;
            }
        }
    }
}